

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O3

Chunk * __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::CreateChunk
          (PageStack<Memory::MarkContext::MarkCandidate> *this)

{
  Chunk *pCVar1;
  
  if (this->pageCount < this->maxPageCount) {
    pCVar1 = (Chunk *)Memory::PagePool::GetPage(this->pagePool,this->usesReservedPages);
    if (pCVar1 == (Chunk *)0x0) {
      pCVar1 = (Chunk *)0x0;
    }
    else {
      this->pageCount = this->pageCount + 1;
    }
    return pCVar1;
  }
  return (Chunk *)0x0;
}

Assistant:

typename PageStack<T>::Chunk * PageStack<T>::CreateChunk()
{
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (pageCount >= maxPageCount)
    {
        return nullptr;
    }
#endif
    Chunk * newChunk = (Chunk *)this->pagePool->GetPage(usesReservedPages);

    if (newChunk == nullptr)
    {
        return nullptr;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    pageCount++;
#endif
    return newChunk;
}